

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

Window createHelperWindow(void)

{
  Window WVar1;
  XSetWindowAttributes wa;
  undefined1 local_70 [72];
  undefined8 local_28;
  
  local_28 = 0x400000;
  WVar1 = XCreateWindow(_glfw.x11.display,_glfw.x11.root,0,0,1,1,0,0,2,
                        *(undefined8 *)
                         (*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 + 0x40
                         ),0x800,local_70);
  return WVar1;
}

Assistant:

static Window createHelperWindow(void)
{
    XSetWindowAttributes wa;
    wa.event_mask = PropertyChangeMask;

    return XCreateWindow(_glfw.x11.display, _glfw.x11.root,
                         0, 0, 1, 1, 0, 0,
                         InputOnly,
                         DefaultVisual(_glfw.x11.display, _glfw.x11.screen),
                         CWEventMask, &wa);
}